

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexer.cpp
# Opt level: O0

void build_terminal_node_mappings<ExtIsoForest>(TreesIndexer *indexer,ExtIsoForest *model)

{
  bool bVar1;
  size_type sVar2;
  reference n_terminal;
  reference pvVar3;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *in_RDI;
  size_t tree;
  SingleTreeIndex *ind;
  iterator __end2;
  iterator __begin2;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *__range2;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *in_stack_ffffffffffffffa8;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *in_stack_ffffffffffffffb0;
  size_t *model_00;
  size_type in_stack_ffffffffffffffc8;
  ulong uVar4;
  ulong __n;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *in_stack_ffffffffffffffd0;
  __normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
  local_20;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *local_18;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *local_8;
  
  local_8 = in_RDI;
  get_ntrees((ExtIsoForest *)0x63e9b2);
  std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::resize
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::shrink_to_fit
            ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)0x63e9c9);
  bVar1 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::empty(in_RDI);
  if (!bVar1) {
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::front(in_stack_ffffffffffffffb0)
    ;
    bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI);
    if (!bVar1) {
      local_18 = local_8;
      local_20._M_current =
           (SingleTreeIndex *)
           std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::begin
                     (in_stack_ffffffffffffffa8);
      std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::end(in_stack_ffffffffffffffa8)
      ;
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                                 *)in_stack_ffffffffffffffb0,
                                (__normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                                 *)in_stack_ffffffffffffffa8), bVar1) {
        __gnu_cxx::
        __normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
        ::operator*(&local_20);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x63ea53);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x63ea61);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x63ea6f);
        __gnu_cxx::
        __normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
        ::operator++(&local_20);
      }
    }
  }
  uVar4 = 0;
  while (__n = uVar4,
        sVar2 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::size(local_8),
        uVar4 < sVar2) {
    n_terminal = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::operator[]
                           (local_8,__n);
    pvVar3 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::operator[](local_8,__n)
    ;
    model_00 = &pvVar3->n_terminal;
    get_tree((ExtIsoForest *)model_00,(size_t)n_terminal);
    build_terminal_node_mappings_single_tree
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)model_00,
               (size_t *)n_terminal,(vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)0x63eaf4);
    uVar4 = __n + 1;
  }
  return;
}

Assistant:

void build_terminal_node_mappings(TreesIndexer &indexer, const Model &model)
{
    indexer.indices.resize(get_ntrees(model));
    indexer.indices.shrink_to_fit();

    if (!indexer.indices.empty() && !indexer.indices.front().reference_points.empty())
    {
        for (auto &ind : indexer.indices)
        {
            ind.reference_points.clear();
            ind.reference_indptr.clear();
            ind.reference_mapping.clear();
        }
    }

    for (size_t tree = 0; tree < indexer.indices.size(); tree++)
    {
        build_terminal_node_mappings_single_tree(indexer.indices[tree].terminal_node_mappings,
                                                 indexer.indices[tree].n_terminal,
                                                 get_tree(model, tree));
    }
}